

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ConditionalStatementSyntax *pCVar1;
  BumpAllocator *unaff_RBX;
  Token TVar2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *unaff_retaddr;
  ConditionalPredicateSyntax *in_stack_00000020;
  Token *in_stack_00000028;
  StatementSyntax *in_stack_00000030;
  ElseClauseSyntax **in_stack_00000038;
  BumpAllocator *in_stack_00000098;
  Token *in_stack_000000a0;
  BumpAllocator *in_stack_ffffffffffffff48;
  StatementSyntax *in_stack_ffffffffffffff50;
  NamedLabelSyntax *local_78;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(unaff_retaddr,unaff_RBX);
  TVar2 = parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator*
            ((not_null<slang::syntax::ConditionalPredicateSyntax_*> *)0xa2f9ee);
  deepClone<slang::syntax::ConditionalPredicateSyntax>
            ((ConditionalPredicateSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  parsing::Token::deepClone(in_stack_000000a0,in_stack_00000098);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0xa2fa3d);
  deepClone<slang::syntax::StatementSyntax>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (*(NamedLabelSyntax **)((long)__fn + 0xa8) != (NamedLabelSyntax *)0x0) {
    deepClone<slang::syntax::ElseClauseSyntax>
              ((ElseClauseSyntax *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ConditionalPredicateSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&,slang::syntax::ElseClauseSyntax*>
                     (unaff_RBX,(NamedLabelSyntax **)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)local_78,(Token *)TVar2.info,TVar2._0_8_,in_stack_00000020,
                      in_stack_00000028,in_stack_00000030,in_stack_00000038);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.uniqueOrPriority.deepClone(alloc),
        node.ifKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ConditionalPredicateSyntax>(*node.predicate, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}